

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_rock_sample.cpp
# Opt level: O0

ScenarioLowerBound * __thiscall
despot::BaseRockSample::CreateScenarioLowerBound
          (BaseRockSample *this,string *name,string *particle_bound_name)

{
  bool bVar1;
  BaseRockSample *pBVar2;
  BeliefMDP *pBVar3;
  ParticleLowerBound *pPVar4;
  RockSampleENTScenarioLowerBound *this_00;
  RockSampleMMAPStateScenarioLowerBound *this_01;
  ostream *poVar5;
  string local_58 [48];
  string *local_28;
  string *particle_bound_name_local;
  string *name_local;
  BaseRockSample *this_local;
  
  local_28 = particle_bound_name;
  particle_bound_name_local = name;
  name_local = (string *)this;
  bVar1 = std::operator==(name,"TRIVIAL");
  if (bVar1) {
    pBVar2 = (BaseRockSample *)operator_new(0x10);
    despot::TrivialParticleLowerBound::TrivialParticleLowerBound
              ((TrivialParticleLowerBound *)pBVar2,(DSPOMDP *)&this->super_BeliefMDP);
    this_local = pBVar2;
  }
  else {
    bVar1 = std::operator==(name,"DEFAULT");
    if ((!bVar1) && (bVar1 = std::operator==(name,"EAST"), !bVar1)) {
      bVar1 = std::operator==(name,"RANDOM");
      if (bVar1) {
        pBVar2 = (BaseRockSample *)operator_new(0x38);
        pBVar3 = &this->super_BeliefMDP;
        std::__cxx11::string::string(local_58,(string *)particle_bound_name);
        pPVar4 = (ParticleLowerBound *)(**(code **)(*(long *)pBVar3 + 0x70))(pBVar3,local_58);
        despot::RandomPolicy::RandomPolicy((RandomPolicy *)pBVar2,(DSPOMDP *)pBVar3,pPVar4);
        this_local = pBVar2;
        std::__cxx11::string::~string(local_58);
        return (ScenarioLowerBound *)this_local;
      }
      bVar1 = std::operator==(name,"ENT");
      if (bVar1) {
        this_00 = (RockSampleENTScenarioLowerBound *)operator_new(0x20);
        RockSampleENTScenarioLowerBound::RockSampleENTScenarioLowerBound
                  (this_00,(DSPOMDP *)&this->super_BeliefMDP);
        return &this_00->super_ScenarioLowerBound;
      }
      bVar1 = std::operator==(name,"MMAP");
      if (bVar1) {
        this_01 = (RockSampleMMAPStateScenarioLowerBound *)operator_new(0x38);
        RockSampleMMAPStateScenarioLowerBound::RockSampleMMAPStateScenarioLowerBound
                  (this_01,(DSPOMDP *)&this->super_BeliefMDP);
        return &this_01->super_ScenarioLowerBound;
      }
      bVar1 = std::operator==(name,"MODE");
      if (bVar1) {
        return (ScenarioLowerBound *)0x0;
      }
      poVar5 = std::operator<<((ostream *)&std::cerr,"Unsupported lower bound algorithm: ");
      poVar5 = std::operator<<(poVar5,(string *)name);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      exit(0);
    }
    pBVar2 = (BaseRockSample *)operator_new(0x20);
    RockSampleEastScenarioLowerBound::RockSampleEastScenarioLowerBound
              ((RockSampleEastScenarioLowerBound *)pBVar2,(DSPOMDP *)&this->super_BeliefMDP);
    this_local = pBVar2;
  }
  return (ScenarioLowerBound *)this_local;
}

Assistant:

ScenarioLowerBound* BaseRockSample::CreateScenarioLowerBound(string name, string
	particle_bound_name) const {
	if (name == "TRIVIAL") {
		return new TrivialParticleLowerBound(this);
	} else if (name == "DEFAULT" || name == "EAST") {
		// scenario_lower_bound_ = new BlindPolicy(this, Compass::EAST);
		return new RockSampleEastScenarioLowerBound(this);
	} else if (name == "RANDOM") {
		return new RandomPolicy(this,
			CreateParticleLowerBound(particle_bound_name));
	} else if (name == "ENT") {
		return new RockSampleENTScenarioLowerBound(this);
	} else if (name == "MMAP") {
		return new RockSampleMMAPStateScenarioLowerBound(this);
	} else if (name == "MODE") {
		// scenario_lower_bound_ = new ModeStatePolicy(this);
		return NULL; // TODO
	} else {
		cerr << "Unsupported lower bound algorithm: " << name << endl;
		exit(0);
		return NULL;
	}
}